

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::setAggregateOperator
          (TIntermediate *this,TIntermNode *node,TOperator op,TType *type,TSourceLoc *loc)

{
  int iVar1;
  TOperator TVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermTyped *pTVar3;
  TSourceLoc *local_60;
  TIntermAggregate *local_38;
  TIntermAggregate *aggNode;
  TSourceLoc *loc_local;
  TType *type_local;
  TIntermNode *pTStack_18;
  TOperator op_local;
  TIntermNode *node_local;
  TIntermediate *this_local;
  
  pTStack_18 = node;
  node_local = (TIntermNode *)this;
  if (node == (TIntermNode *)0x0) {
    local_38 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,0);
    TIntermAggregate::TIntermAggregate(local_38);
  }
  else {
    iVar1 = (*node->_vptr_TIntermNode[6])();
    local_38 = (TIntermAggregate *)CONCAT44(extraout_var,iVar1);
    if ((local_38 == (TIntermAggregate *)0x0) ||
       (TVar2 = TIntermOperator::getOp((TIntermOperator *)local_38), TVar2 != EOpNull)) {
      local_38 = (TIntermAggregate *)TIntermNode::operator_new((TIntermNode *)0x188,(size_t)node);
      TIntermAggregate::TIntermAggregate(local_38);
      iVar1 = (*(local_38->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])();
      std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
                ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                 CONCAT44(extraout_var_00,iVar1),&stack0xffffffffffffffe8);
    }
  }
  (*(local_38->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x31])
            (local_38,(ulong)op);
  if ((loc->line != 0) || (pTStack_18 != (TIntermNode *)0x0)) {
    local_60 = loc;
    if (loc->line == 0) {
      iVar1 = (**pTStack_18->_vptr_TIntermNode)();
      local_60 = (TSourceLoc *)CONCAT44(extraout_var_01,iVar1);
    }
    (*(local_38->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
              (local_38,local_60);
  }
  (*(local_38->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
            (local_38,type);
  pTVar3 = fold(this,local_38);
  return pTVar3;
}

Assistant:

TIntermTyped* TIntermediate::setAggregateOperator(TIntermNode* node, TOperator op, const TType& type,
    const TSourceLoc& loc)
{
    TIntermAggregate* aggNode;

    //
    // Make sure we have an aggregate.  If not turn it into one.
    //
    if (node != nullptr) {
        aggNode = node->getAsAggregate();
        if (aggNode == nullptr || aggNode->getOp() != EOpNull) {
            //
            // Make an aggregate containing this node.
            //
            aggNode = new TIntermAggregate();
            aggNode->getSequence().push_back(node);
        }
    } else
        aggNode = new TIntermAggregate();

    //
    // Set the operator.
    //
    aggNode->setOperator(op);
    if (loc.line != 0 || node != nullptr)
        aggNode->setLoc(loc.line != 0 ? loc : node->getLoc());

    aggNode->setType(type);

    return fold(aggNode);
}